

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall Refal2::CFunctionBuilder::addRule(CFunctionBuilder *this)

{
  CRule *this_00;
  CRule *pCVar1;
  
  if ((this->firstRule)._M_t.
      super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
      super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
      super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl == (CRule *)0x0) {
    pCVar1 = (CRule *)operator_new(0x60);
    CRule::CRule(pCVar1);
    std::__uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::reset
              ((__uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_> *)
               &this->firstRule,pCVar1);
    pCVar1 = (this->firstRule)._M_t.
             super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
             super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
             super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl;
  }
  else {
    pCVar1 = this->lastRule;
    this_00 = (CRule *)operator_new(0x60);
    CRule::CRule(this_00);
    std::__uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>::reset
              ((__uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_> *)
               &pCVar1->NextRule,this_00);
    pCVar1 = (this->lastRule->NextRule)._M_t.
             super___uniq_ptr_impl<Refal2::CRule,_std::default_delete<Refal2::CRule>_>._M_t.
             super__Tuple_impl<0UL,_Refal2::CRule_*,_std::default_delete<Refal2::CRule>_>.
             super__Head_base<0UL,_Refal2::CRule_*,_false>._M_head_impl;
  }
  this->lastRule = pCVar1;
  pCVar1->RightMatching = (bool)(this->super_CVariablesBuilder).field_0x1aad;
  CNodeList<Refal2::CUnit>::Move
            (&(this->leftPart).super_CNodeList<Refal2::CUnit>,(CNodeList<Refal2::CUnit> *)pCVar1);
  CNodeList<Refal2::CUnit>::Move
            (&(this->acc).super_CNodeList<Refal2::CUnit>,
             &(this->lastRule->Right).super_CNodeList<Refal2::CUnit>);
  CVariablesBuilder::Export(&this->super_CVariablesBuilder,&this->lastRule->Variables);
  return;
}

Assistant:

void CFunctionBuilder::addRule()
{
	if( static_cast<bool>( firstRule ) ) {
		lastRule->NextRule.reset( new CRule );
		lastRule = lastRule->NextRule.get();
	} else {
		firstRule.reset( new CRule );
		lastRule = firstRule.get();
	}

	lastRule->RightMatching = isRightDirection;
	leftPart.Move( lastRule->Left );
	acc.Move( lastRule->Right );
	CVariablesBuilder::Export( lastRule->Variables );
}